

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool tinyusdz::Path::LessThan(Path *lhs,Path *rhs)

{
  char cVar1;
  size_type sVar2;
  size_type sVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __type _Var6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rhs_prim_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lhs_prim_names;
  allocator local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  string local_48;
  
  if (lhs->_valid == true) {
    if (rhs->_valid != true) {
      return true;
    }
    if ((lhs->_prim_part)._M_string_length != 0) {
      cVar1 = *(lhs->_prim_part)._M_dataplus._M_p;
      if ((cVar1 == '/') && ((rhs->_prim_part)._M_string_length != 0)) {
        if (*(rhs->_prim_part)._M_dataplus._M_p != '/') {
          return true;
        }
        _Var6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)rhs);
        if (!_Var6) {
          ::std::__cxx11::string::string((string *)&local_48,"/",(allocator *)&local_78);
          split(&local_60,(string *)lhs,&local_48,0x147ae14);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::string((string *)&local_48,"/",&local_79);
          split(&local_78,(string *)rhs,&local_48,0x147ae14);
          ::std::__cxx11::string::_M_dispose();
          if (local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            bVar7 = local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    local_78.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          }
          else if (local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
                   local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
            bVar7 = false;
          }
          else {
            uVar8 = (long)local_60.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_60.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5;
            uVar9 = (long)local_78.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_78.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (uVar8 <= uVar9) {
              uVar9 = uVar8;
            }
            lVar11 = uVar9 + 1;
            lVar12 = 0;
            do {
              lVar11 = lVar11 + -1;
              if (lVar11 == 0) {
                bVar7 = (ulong)((long)local_60.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_60.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) <
                        (ulong)((long)local_78.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_78.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                goto LAB_0020c1dd;
              }
              bVar7 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&((local_60.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12),
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&((local_78.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12));
              lVar12 = lVar12 + 0x20;
            } while (!bVar7);
            if (uVar9 < 2) {
              lVar11 = 0;
            }
            else {
              lVar11 = uVar9 - 1;
              lVar12 = uVar9 - 2;
              lVar10 = uVar9 * 0x20 + -0x40;
              while (bVar7 = lVar12 != 0, lVar12 = lVar12 + -1, bVar7) {
                bVar7 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&((local_60.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar10),
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)((long)&((local_78.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar10));
                lVar11 = lVar11 - (ulong)bVar7;
                lVar10 = lVar10 + -0x20;
              }
            }
            _Var4._M_current =
                 local_60.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_dataplus._M_p;
            _Var5._M_current =
                 local_78.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_dataplus._M_p;
            bVar7 = lexicographical_compare<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              (_Var4,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(_Var4._M_current +
                                       local_60.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                       _M_string_length),_Var5,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var5._M_current +
                                 local_78.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar11]._M_string_length)
                              );
          }
LAB_0020c1dd:
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_60);
          return bVar7;
        }
        sVar2 = (lhs->_prop_part)._M_string_length;
        if (sVar2 == 0) {
          return true;
        }
        sVar3 = (rhs->_prop_part)._M_string_length;
        if (sVar3 != 0) {
          _Var4._M_current = (lhs->_prop_part)._M_dataplus._M_p;
          _Var5._M_current = (rhs->_prop_part)._M_dataplus._M_p;
          bVar7 = lexicographical_compare<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            (_Var4,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var4._M_current + sVar2),_Var5,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(_Var5._M_current + sVar3));
          return bVar7;
        }
      }
      else if (cVar1 == '/') {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Path::LessThan(const Path &lhs, const Path &rhs) {
  // DCOUT("LessThan");
  if (lhs.is_valid() && rhs.is_valid()) {
    // ok
  } else {
    // Even though this should not happen,
    // valid paths is less than invalid paths
    return lhs.is_valid();
  }

  // TODO: handle relative path correctly.
  if (lhs.is_absolute_path() && rhs.is_absolute_path()) {
    // ok
  } else {
    // Absolute paths are less than relative paths
    return lhs.is_absolute_path();
  }

  if (lhs.prim_part() == rhs.prim_part()) {
    // compare property
    const std::string &lhs_prop_part = lhs.prop_part();
    const std::string &rhs_prop_part = rhs.prop_part();

    if (lhs_prop_part.empty() || rhs_prop_part.empty()) {
      return lhs_prop_part.empty();
    }

    return ::tinyusdz::lexicographical_compare(
        lhs_prop_part.begin(), lhs_prop_part.end(), rhs_prop_part.begin(),
        rhs_prop_part.end());

  } else {
    const std::vector<std::string> lhs_prim_names = split(lhs.prim_part(), "/");
    const std::vector<std::string> rhs_prim_names = split(rhs.prim_part(), "/");
    // DCOUT("lhs_names = " << to_string(lhs_prim_names));
    // DCOUT("rhs_names = " << to_string(rhs_prim_names));

    if (lhs_prim_names.empty() || rhs_prim_names.empty()) {
      return lhs_prim_names.empty() && rhs_prim_names.size();
    }

    // common shortest depth.
    size_t didx = (std::min)(lhs_prim_names.size(), rhs_prim_names.size());

    bool same_until_common_depth = true;
    for (size_t i = 0; i < didx; i++) {
      if (lhs_prim_names[i] != rhs_prim_names[i]) {
        same_until_common_depth = false;
        break;
      }
    }

    if (same_until_common_depth) {
      // tail differs. compare by depth count.
      return lhs_prim_names.size() < rhs_prim_names.size();
    }

    // Walk until common ancestor is found
    size_t child_idx = didx - 1;
    // DCOUT("common_depth_idx = " << didx << ", lcount = " <<
    // lhs_prim_names.size() << ", rcount = " << rhs_prim_names.size());
    if (didx > 1) {
      for (size_t parent_idx = didx - 2; parent_idx > 0; parent_idx--) {
        // DCOUT("parent_idx = " << parent_idx);
        if (lhs_prim_names[parent_idx] != rhs_prim_names[parent_idx]) {
          child_idx--;
        }
      }
    }
    // DCOUT("child_idx = " << child_idx);

    // compare child node
    return ::tinyusdz::lexicographical_compare(
        lhs_prim_names[child_idx].begin(), lhs_prim_names[child_idx].end(),
        rhs_prim_names[child_idx].begin(), rhs_prim_names[child_idx].end());
  }
}